

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionCond::get_code_repr(InstructionCond *this,ostream *os)

{
  ostream *poVar1;
  string code;
  allocator local_51;
  String local_50;
  String local_30;
  
  std::__cxx11::string::string((string *)&local_30,"d",&local_51);
  Cond::ok_cpp(&local_50,&this->cond,&local_30,&this->not_in);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<(os,"COND ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->off_data);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void InstructionCond::get_code_repr( std::ostream &os ) {
    std::string code = cond.ok_cpp( "d", &not_in );
    os << "COND " << off_data << " " << code.size() << " " << code;
}